

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O3

bool __thiscall CoinStatsIndex::CustomAppend(CoinStatsIndex *this,BlockInfo *block)

{
  pointer pCVar1;
  undefined8 *puVar2;
  uchar *puVar3;
  int iVar4;
  uint256 *puVar5;
  CBlock *pCVar6;
  CDBWrapper *_parent;
  bool bVar7;
  CChainParams *consensusParams;
  CAmount CVar8;
  long lVar9;
  CBlockIndex *index;
  uint256 **ppuVar10;
  uint64_t uVar11;
  ulong uVar12;
  uint uVar13;
  undefined1 auVar14 [8];
  uint uVar15;
  ulong uVar16;
  element_type *peVar17;
  long lVar18;
  pointer psVar19;
  pointer pCVar20;
  pointer pCVar21;
  long lVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Span<const_std::byte> key;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  ulong local_1d0;
  CBlockUndo block_undo;
  uint256 out;
  uint256 expected_block_hash;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict read_out;
  undefined1 local_98 [8];
  undefined1 auStack_90 [8];
  DataStream local_88;
  DataStream local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = block->height;
  consensusParams = Params();
  CVar8 = GetBlockSubsidy(iVar4,&consensusParams->consensus);
  lVar9 = this->m_total_subsidy + CVar8;
  this->m_total_subsidy = lVar9;
  if (block->height < 1) {
    lVar22 = this->m_total_unspendable_amount + CVar8;
    this->m_total_unspendable_amount = lVar22;
    read_out.second.total_unspendables_genesis_block =
         CVar8 + this->m_total_unspendables_genesis_block;
    this->m_total_unspendables_genesis_block = read_out.second.total_unspendables_genesis_block;
LAB_0088a169:
    read_out.second.total_prevout_spent_amount = this->m_total_prevout_spent_amount;
    read_out.second.total_new_outputs_ex_coinbase_amount =
         this->m_total_new_outputs_ex_coinbase_amount;
    read_out.second.total_coinbase_amount = this->m_total_coinbase_amount;
    lVar18 = (lVar9 + read_out.second.total_prevout_spent_amount) -
             (read_out.second.total_new_outputs_ex_coinbase_amount +
              read_out.second.total_coinbase_amount + lVar22);
    read_out.second.total_unspendable_amount = lVar22 + lVar18;
    this->m_total_unspendable_amount = read_out.second.total_unspendable_amount;
    read_out.second.total_unspendables_unclaimed_rewards =
         lVar18 + this->m_total_unspendables_unclaimed_rewards;
    this->m_total_unspendables_unclaimed_rewards =
         read_out.second.total_unspendables_unclaimed_rewards;
    puVar5 = block->hash;
    read_out.first.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
    read_out.first.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
    read_out.first.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
    read_out.first.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
    read_out.second.transaction_output_count = this->m_transaction_output_count;
    read_out.second.bogo_size = this->m_bogo_size;
    read_out.second.total_amount = this->m_total_amount;
    read_out.second.total_unspendables_bip30 = this->m_total_unspendables_bip30;
    read_out.second.total_unspendables_scripts = this->m_total_unspendables_scripts;
    out.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    read_out.second.total_subsidy = lVar9;
    MuHash3072::Finalize(&this->m_muhash,&out);
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x10] =
         out.super_base_blob<256U>.m_data._M_elems[0x10];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x11] =
         out.super_base_blob<256U>.m_data._M_elems[0x11];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x12] =
         out.super_base_blob<256U>.m_data._M_elems[0x12];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x13] =
         out.super_base_blob<256U>.m_data._M_elems[0x13];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x14] =
         out.super_base_blob<256U>.m_data._M_elems[0x14];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x15] =
         out.super_base_blob<256U>.m_data._M_elems[0x15];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x16] =
         out.super_base_blob<256U>.m_data._M_elems[0x16];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x17] =
         out.super_base_blob<256U>.m_data._M_elems[0x17];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x18] =
         out.super_base_blob<256U>.m_data._M_elems[0x18];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x19] =
         out.super_base_blob<256U>.m_data._M_elems[0x19];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         out.super_base_blob<256U>.m_data._M_elems[0x1a];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         out.super_base_blob<256U>.m_data._M_elems[0x1b];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         out.super_base_blob<256U>.m_data._M_elems[0x1c];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         out.super_base_blob<256U>.m_data._M_elems[0x1d];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         out.super_base_blob<256U>.m_data._M_elems[0x1e];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         out.super_base_blob<256U>.m_data._M_elems[0x1f];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0] =
         out.super_base_blob<256U>.m_data._M_elems[0];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[1] =
         out.super_base_blob<256U>.m_data._M_elems[1];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[2] =
         out.super_base_blob<256U>.m_data._M_elems[2];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[3] =
         out.super_base_blob<256U>.m_data._M_elems[3];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[4] =
         out.super_base_blob<256U>.m_data._M_elems[4];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[5] =
         out.super_base_blob<256U>.m_data._M_elems[5];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[6] =
         out.super_base_blob<256U>.m_data._M_elems[6];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[7] =
         out.super_base_blob<256U>.m_data._M_elems[7];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[8] =
         out.super_base_blob<256U>.m_data._M_elems[8];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[9] =
         out.super_base_blob<256U>.m_data._M_elems[9];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[10] =
         out.super_base_blob<256U>.m_data._M_elems[10];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xb] =
         out.super_base_blob<256U>.m_data._M_elems[0xb];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xc] =
         out.super_base_blob<256U>.m_data._M_elems[0xc];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xd] =
         out.super_base_blob<256U>.m_data._M_elems[0xd];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xe] =
         out.super_base_blob<256U>.m_data._M_elems[0xe];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xf] =
         out.super_base_blob<256U>.m_data._M_elems[0xf];
    _parent = &((this->m_db)._M_t.
                super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t.
                super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper;
    iVar4 = block->height;
    expected_block_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)iVar4;
    expected_block_hash.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((uint)iVar4 >> 8);
    expected_block_hash.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((uint)iVar4 >> 0x10);
    expected_block_hash.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((uint)iVar4 >> 0x18);
    CDBBatch::CDBBatch((CDBBatch *)local_98,_parent);
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
              (&local_88.vch,local_88.m_read_pos + 0x40);
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
              (&local_68.vch,local_68.m_read_pos + 0x400);
    DataStream::operator<<(&local_88,(DBHeightKey *)&expected_block_hash);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_68,
               local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,&read_out,&read_out.second);
    Serialize<DataStream,_(anonymous_namespace)::DBVal>(&local_68,&read_out.second);
    key.m_data = (byte *)(CONCAT17(local_88.vch.
                                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                   ._M_impl.super__Vector_impl_data._M_start._7_1_,
                                   CONCAT16(local_88.vch.
                                            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                            ._M_impl.super__Vector_impl_data._M_start._6_1_,
                                            CONCAT15(local_88.vch.
                                                                                                          
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._5_1_,
                                                  CONCAT14(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_1_,
                                                  CONCAT13(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  local_88.vch.
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_)))
                                                  )))) + local_88.m_read_pos);
    key.m_size = (long)local_88.vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)key.m_data;
    CDBBatch::WriteImpl((CDBBatch *)local_98,key,&local_68);
    lVar9 = CONCAT17(local_88.vch.
                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start._7_1_,
                     CONCAT16(local_88.vch.
                              super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start._6_1_,
                              CONCAT15(local_88.vch.
                                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                       ._M_impl.super__Vector_impl_data._M_start._5_1_,
                                       CONCAT14(local_88.vch.
                                                super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                ._M_impl.super__Vector_impl_data._M_start._4_1_,
                                                CONCAT13(local_88.vch.
                                                                                                                  
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  local_88.vch.
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_)))
                                               ))));
    if (local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)lVar9) {
      local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)lVar9;
    }
    local_88.m_read_pos = 0;
    if (local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
           .super__Vector_impl_data._M_start;
    }
    local_68.m_read_pos = 0;
    bVar7 = CDBWrapper::WriteBatch(_parent,(CDBBatch *)local_98,false);
    CDBBatch::~CDBBatch((CDBBatch *)local_98);
  }
  else {
    read_out.first.super_base_blob<256U>.m_data._M_elems._0_8_ = &cs_main;
    read_out.first.super_base_blob<256U>.m_data._M_elems._8_8_ =
         read_out.first.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&read_out);
    index = ::node::BlockManager::LookupBlockIndex
                      (((this->super_BaseIndex).m_chainstate)->m_blockman,block->hash);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&read_out);
    bVar7 = ::node::BlockManager::UndoReadFromDisk
                      (((this->super_BaseIndex).m_chainstate)->m_blockman,&block_undo,index);
    if (bVar7) {
      memset(&read_out,0,0xa0);
      local_98._0_4_ = block->height + -1;
      bVar7 = CDBWrapper::
              Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                        (&((this->m_db)._M_t.
                           super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                           .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                          super_CDBWrapper,(DBHeightKey *)local_98,&read_out);
      if (bVar7) {
        ppuVar10 = inline_assertion_check<true,uint256_const*const&>
                             (&block->prev_hash,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/coinstatsindex.cpp"
                              ,0x87,"CustomAppend","block.prev_hash");
        puVar5 = *ppuVar10;
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[1] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[1];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[2] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[2];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[3] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[3];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[4] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[4];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[5] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[5];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[6] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[6];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[7] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[7];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[8] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[8];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[9] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[9];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[10] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[10];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xb];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xc];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xd];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xe];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xf];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x10];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x11];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x12];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x13];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x14];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x15];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x16];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x17];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x18];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x19];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1a];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1b];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1c];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1d];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1e];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1f];
        auVar23[0] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[0]);
        auVar23[1] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[1]);
        auVar23[2] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[2]);
        auVar23[3] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[3]);
        auVar23[4] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[4]);
        auVar23[5] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[5]);
        auVar23[6] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[6]);
        auVar23[7] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[7]);
        auVar23[8] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[8]);
        auVar23[9] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[9]);
        auVar23[10] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                       read_out.first.super_base_blob<256U>.m_data._M_elems[10]);
        auVar23[0xb] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] ==
                        read_out.first.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar23[0xc] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] ==
                        read_out.first.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar23[0xd] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] ==
                        read_out.first.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar23[0xe] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] ==
                        read_out.first.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar23[0xf] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] ==
                        read_out.first.super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar24[0] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x10] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar24[1] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x11] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar24[2] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x12] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar24[3] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x13] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar24[4] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x14] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar24[5] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x15] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar24[6] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x16] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar24[7] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x17] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar24[8] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x18] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar24[9] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x19] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar24[10] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                       expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar24[0xb] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar24[0xc] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar24[0xd] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar24[0xe] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar24[0xf] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar23 = auVar23 & auVar24;
        if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) {
          base_blob<256u>::ToString_abi_cxx11_((string *)local_98,&read_out);
          base_blob<256u>::ToString_abi_cxx11_((string *)&out,&expected_block_hash);
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/coinstatsindex.cpp"
          ;
          source_file._M_len = 0x68;
          logging_function._M_str = "CustomAppend";
          logging_function._M_len = 0xc;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                    (logging_function,source_file,0x8a,ALL,Info,(ConstevalFormatString<2U>)0xf70a99,
                     (string *)local_98,(string *)&out);
          if ((uchar *)out.super_base_blob<256U>.m_data._M_elems._0_8_ !=
              out.super_base_blob<256U>.m_data._M_elems + 0x10) {
            operator_delete((void *)out.super_base_blob<256U>.m_data._M_elems._0_8_,
                            out.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
          }
          if (local_98 != (undefined1  [8])&local_88) {
            operator_delete((void *)local_98,
                            CONCAT17(local_88.vch.
                                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                     ._M_impl.super__Vector_impl_data._M_start._7_1_,
                                     CONCAT16(local_88.vch.
                                              super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                              ._M_impl.super__Vector_impl_data._M_start._6_1_,
                                              CONCAT15(local_88.vch.
                                                                                                              
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._5_1_,
                                                  CONCAT14(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_1_,
                                                  CONCAT13(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  local_88.vch.
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_)))
                                                  )))) + 1);
          }
          local_98 = (undefined1  [8])
                     CONCAT17(expected_block_hash.super_base_blob<256U>.m_data._M_elems[7],
                              CONCAT16(expected_block_hash.super_base_blob<256U>.m_data._M_elems[6],
                                       CONCAT15(expected_block_hash.super_base_blob<256U>.m_data.
                                                _M_elems[5],
                                                CONCAT14(expected_block_hash.super_base_blob<256U>.
                                                         m_data._M_elems[4],
                                                         CONCAT13(expected_block_hash.
                                                                  super_base_blob<256U>.m_data.
                                                                  _M_elems[3],
                                                                  CONCAT12(expected_block_hash.
                                                                           super_base_blob<256U>.
                                                                           m_data._M_elems[2],
                                                                           CONCAT11(
                                                  expected_block_hash.super_base_blob<256U>.m_data.
                                                  _M_elems[1],
                                                  expected_block_hash.super_base_blob<256U>.m_data.
                                                  _M_elems[0])))))));
          auStack_90 = (undefined1  [8])
                       CONCAT17(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xf],
                                CONCAT16(expected_block_hash.super_base_blob<256U>.m_data._M_elems
                                         [0xe],CONCAT15(expected_block_hash.super_base_blob<256U>.
                                                        m_data._M_elems[0xd],
                                                        CONCAT14(expected_block_hash.
                                                                 super_base_blob<256U>.m_data.
                                                                 _M_elems[0xc],
                                                                 CONCAT13(expected_block_hash.
                                                                          super_base_blob<256U>.
                                                                          m_data._M_elems[0xb],
                                                                          CONCAT12(
                                                  expected_block_hash.super_base_blob<256U>.m_data.
                                                  _M_elems[10],
                                                  CONCAT11(expected_block_hash.super_base_blob<256U>
                                                           .m_data._M_elems[9],
                                                           expected_block_hash.super_base_blob<256U>
                                                           .m_data._M_elems[8])))))));
          local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
          local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start._1_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
          local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start._2_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
          local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start._3_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
          local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start._4_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
          local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start._5_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
          local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start._6_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
          local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start._7_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x17];
          local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT17(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f],
                                 CONCAT16(expected_block_hash.super_base_blob<256U>.m_data._M_elems
                                          [0x1e],CONCAT15(expected_block_hash.super_base_blob<256U>.
                                                          m_data._M_elems[0x1d],
                                                          CONCAT14(expected_block_hash.
                                                                   super_base_blob<256U>.m_data.
                                                                   _M_elems[0x1c],
                                                                   CONCAT13(expected_block_hash.
                                                                            super_base_blob<256U>.
                                                                            m_data._M_elems[0x1b],
                                                                            CONCAT12(
                                                  expected_block_hash.super_base_blob<256U>.m_data.
                                                  _M_elems[0x1a],
                                                  CONCAT11(expected_block_hash.super_base_blob<256U>
                                                           .m_data._M_elems[0x19],
                                                           expected_block_hash.super_base_blob<256U>
                                                           .m_data._M_elems[0x18])))))));
          bVar7 = CDBWrapper::
                  Read<(anonymous_namespace)::DBHashKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                            (&((this->m_db)._M_t.
                               super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                               .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                              super_CDBWrapper,(DBHashKey *)local_98,&read_out);
          if (!bVar7) {
            base_blob<256u>::ToString_abi_cxx11_((string *)local_98,&expected_block_hash);
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/coinstatsindex.cpp"
            ;
            source_file_00._M_len = 0x68;
            logging_function_00._M_str = "CustomAppend";
            logging_function_00._M_len = 0xc;
            LogPrintFormatInternal<char[13],std::__cxx11::string>
                      (logging_function_00,source_file_00,0x8e,ALL,Error,
                       (ConstevalFormatString<2U>)0xf70ae5,(char (*) [13])"CustomAppend",
                       (string *)local_98);
            if (local_98 != (undefined1  [8])&local_88) {
              operator_delete((void *)local_98,
                              CONCAT17(local_88.vch.
                                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                       ._M_impl.super__Vector_impl_data._M_start._7_1_,
                                       CONCAT16(local_88.vch.
                                                super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                ._M_impl.super__Vector_impl_data._M_start._6_1_,
                                                CONCAT15(local_88.vch.
                                                                                                                  
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._5_1_,
                                                  CONCAT14(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_1_,
                                                  CONCAT13(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_88.vch.
                                                                                                                      
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  local_88.vch.
                                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_)))
                                                  )))) + 1);
            }
            goto LAB_0088a3ee;
          }
        }
        pCVar6 = block->data;
        if (pCVar6 == (CBlock *)0x0) {
LAB_0088a44a:
          __assert_fail("block.data",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/coinstatsindex.cpp"
                        ,0x94,
                        "virtual bool CoinStatsIndex::CustomAppend(const interfaces::BlockInfo &)");
        }
        psVar19 = (pCVar6->vtx).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((pCVar6->vtx).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != psVar19) {
          local_1d0 = 0;
          do {
            bVar7 = IsBIP30Unspendable(index);
            psVar19 = psVar19 + local_1d0;
            if (bVar7) {
              bVar7 = CTransaction::IsCoinBase
                                ((psVar19->
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                                 ._M_ptr);
              if (!bVar7) goto LAB_00889e3a;
              this->m_total_unspendable_amount = this->m_total_unspendable_amount + CVar8;
              this->m_total_unspendables_bip30 = this->m_total_unspendables_bip30 + CVar8;
            }
            else {
LAB_00889e3a:
              peVar17 = (psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              pCVar20 = (peVar17->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((peVar17->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish != pCVar20) {
                uVar15 = 1;
                uVar16 = 0;
                do {
                  iVar4 = block->height;
                  bVar7 = CTransaction::IsCoinBase(peVar17);
                  local_98 = *(undefined1 (*) [8])
                              ((long)(&pCVar20[uVar16].scriptPubKey + -1) + 0x18);
                  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)auStack_90,
                             &pCVar20[uVar16].scriptPubKey.super_CScriptBase);
                  local_88.m_read_pos = CONCAT44(local_88.m_read_pos._4_4_,(uint)bVar7 + iVar4 * 2);
                  peVar17 = (psVar19->
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr;
                  out.super_base_blob<256U>.m_data._M_elems._0_8_ =
                       *(undefined8 *)
                        (peVar17->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                  out.super_base_blob<256U>.m_data._M_elems._8_8_ =
                       *(undefined8 *)
                        ((long)(peVar17->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
                  out.super_base_blob<256U>.m_data._M_elems._16_8_ =
                       *(undefined8 *)
                        ((long)(peVar17->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        0x10);
                  out.super_base_blob<256U>.m_data._M_elems._24_8_ =
                       *(undefined8 *)
                        ((long)(peVar17->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        0x18);
                  uVar13 = local_88.vch.
                           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ - 0x1d;
                  if (local_88.vch.
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x1d) {
                    uVar13 = local_88.vch.
                             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                  }
                  if (uVar13 == 0) {
LAB_00889ef5:
                    kernel::ApplyCoinHash(&this->m_muhash,(COutPoint *)&out,(Coin *)local_98);
                    bVar7 = CTransaction::IsCoinBase
                                      ((psVar19->
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr);
                    (&this->m_total_new_outputs_ex_coinbase_amount)[bVar7] =
                         (CAmount)((long)local_98 +
                                  (&this->m_total_new_outputs_ex_coinbase_amount)[bVar7]);
                    this->m_transaction_output_count = this->m_transaction_output_count + 1;
                    this->m_total_amount = (CAmount)((long)local_98 + this->m_total_amount);
                    uVar11 = kernel::GetBogoSize((CScript *)auStack_90);
                    this->m_bogo_size = this->m_bogo_size + uVar11;
                  }
                  else {
                    auVar14 = (undefined1  [8])auStack_90;
                    if (0x1c < local_88.vch.
                               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
                      auVar14 = auStack_90;
                    }
                    if ((uVar13 < 0x2711) && (*(char *)auVar14 != 'j')) goto LAB_00889ef5;
                    this->m_total_unspendable_amount =
                         (CAmount)((long)local_98 + this->m_total_unspendable_amount);
                    this->m_total_unspendables_scripts =
                         (CAmount)((long)local_98 + this->m_total_unspendables_scripts);
                  }
                  if (0x1c < local_88.vch.
                             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
                    free((void *)auStack_90);
                  }
                  uVar16 = (ulong)uVar15;
                  peVar17 = (psVar19->
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr;
                  pCVar20 = (peVar17->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  uVar12 = ((long)(peVar17->vout).
                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pCVar20 >> 3) *
                           -0x3333333333333333;
                  uVar15 = uVar15 + 1;
                } while (uVar16 <= uVar12 && uVar12 - uVar16 != 0);
              }
              bVar7 = CTransaction::IsCoinBase(peVar17);
              if (!bVar7) {
                uVar16 = local_1d0 - 1;
                uVar12 = ((long)block_undo.vtxundo.
                                super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)block_undo.vtxundo.
                                super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
                if (uVar12 < uVar16 || uVar12 - uVar16 == 0) {
                  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0088a5a3;
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                  goto LAB_0088a44a;
                }
                pCVar21 = block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar16].vprevout.
                          super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar16].vprevout.
                    super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
                    _M_finish != pCVar21) {
                  pCVar1 = block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar16;
                  lVar22 = 0x20;
                  lVar9 = 0;
                  uVar16 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)&(pCVar21->out).nValue + lVar9);
                    local_98 = (undefined1  [8])*puVar2;
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)auStack_90,
                               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(puVar2 + 1));
                    local_88.m_read_pos =
                         CONCAT44(local_88.m_read_pos._4_4_,
                                  *(undefined4 *)(&pCVar21->field_0x28 + lVar9));
                    lVar18 = (long)(((psVar19->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->vin).
                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                    puVar3 = (uchar *)(lVar18 + -0x20 + lVar22);
                    out.super_base_blob<256U>.m_data._M_elems._0_8_ = *(undefined8 *)puVar3;
                    out.super_base_blob<256U>.m_data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 8);
                    puVar3 = (uchar *)(lVar18 + -0x10 + lVar22);
                    out.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar3;
                    out.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 8);
                    kernel::RemoveCoinHash(&this->m_muhash,(COutPoint *)&out,(Coin *)local_98);
                    this->m_total_prevout_spent_amount =
                         (CAmount)((long)local_98 + this->m_total_prevout_spent_amount);
                    this->m_transaction_output_count = this->m_transaction_output_count - 1;
                    this->m_total_amount = this->m_total_amount - (long)local_98;
                    uVar11 = kernel::GetBogoSize((CScript *)auStack_90);
                    this->m_bogo_size = this->m_bogo_size - uVar11;
                    if (0x1c < local_88.vch.
                               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
                      free((void *)auStack_90);
                    }
                    uVar16 = uVar16 + 1;
                    pCVar21 = (pCVar1->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    lVar9 = lVar9 + 0x30;
                    lVar22 = lVar22 + 0x68;
                  } while (uVar16 < (ulong)(((long)(pCVar1->vprevout).
                                                   super__Vector_base<Coin,_std::allocator<Coin>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                             (long)pCVar21 >> 4) * -0x5555555555555555));
                }
              }
            }
            local_1d0 = local_1d0 + 1;
            psVar19 = (block->data->vtx).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (local_1d0 <
                   (ulong)((long)(block->data->vtx).
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar19 >> 4));
        }
        lVar9 = this->m_total_subsidy;
        lVar22 = this->m_total_unspendable_amount;
        read_out.second.total_unspendables_genesis_block = this->m_total_unspendables_genesis_block;
        goto LAB_0088a169;
      }
    }
LAB_0088a3ee:
    bVar7 = false;
  }
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&block_undo.vtxundo);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
LAB_0088a5a3:
  __stack_chk_fail();
}

Assistant:

bool CoinStatsIndex::CustomAppend(const interfaces::BlockInfo& block)
{
    CBlockUndo block_undo;
    const CAmount block_subsidy{GetBlockSubsidy(block.height, Params().GetConsensus())};
    m_total_subsidy += block_subsidy;

    // Ignore genesis block
    if (block.height > 0) {
        // pindex variable gives indexing code access to node internals. It
        // will be removed in upcoming commit
        const CBlockIndex* pindex = WITH_LOCK(cs_main, return m_chainstate->m_blockman.LookupBlockIndex(block.hash));
        if (!m_chainstate->m_blockman.UndoReadFromDisk(block_undo, *pindex)) {
            return false;
        }

        std::pair<uint256, DBVal> read_out;
        if (!m_db->Read(DBHeightKey(block.height - 1), read_out)) {
            return false;
        }

        uint256 expected_block_hash{*Assert(block.prev_hash)};
        if (read_out.first != expected_block_hash) {
            LogPrintf("WARNING: previous block header belongs to unexpected block %s; expected %s\n",
                      read_out.first.ToString(), expected_block_hash.ToString());

            if (!m_db->Read(DBHashKey(expected_block_hash), read_out)) {
                LogError("%s: previous block header not found; expected %s\n",
                             __func__, expected_block_hash.ToString());
                return false;
            }
        }

        // Add the new utxos created from the block
        assert(block.data);
        for (size_t i = 0; i < block.data->vtx.size(); ++i) {
            const auto& tx{block.data->vtx.at(i)};

            // Skip duplicate txid coinbase transactions (BIP30).
            if (IsBIP30Unspendable(*pindex) && tx->IsCoinBase()) {
                m_total_unspendable_amount += block_subsidy;
                m_total_unspendables_bip30 += block_subsidy;
                continue;
            }

            for (uint32_t j = 0; j < tx->vout.size(); ++j) {
                const CTxOut& out{tx->vout[j]};
                Coin coin{out, block.height, tx->IsCoinBase()};
                COutPoint outpoint{tx->GetHash(), j};

                // Skip unspendable coins
                if (coin.out.scriptPubKey.IsUnspendable()) {
                    m_total_unspendable_amount += coin.out.nValue;
                    m_total_unspendables_scripts += coin.out.nValue;
                    continue;
                }

                ApplyCoinHash(m_muhash, outpoint, coin);

                if (tx->IsCoinBase()) {
                    m_total_coinbase_amount += coin.out.nValue;
                } else {
                    m_total_new_outputs_ex_coinbase_amount += coin.out.nValue;
                }

                ++m_transaction_output_count;
                m_total_amount += coin.out.nValue;
                m_bogo_size += GetBogoSize(coin.out.scriptPubKey);
            }

            // The coinbase tx has no undo data since no former output is spent
            if (!tx->IsCoinBase()) {
                const auto& tx_undo{block_undo.vtxundo.at(i - 1)};

                for (size_t j = 0; j < tx_undo.vprevout.size(); ++j) {
                    Coin coin{tx_undo.vprevout[j]};
                    COutPoint outpoint{tx->vin[j].prevout.hash, tx->vin[j].prevout.n};

                    RemoveCoinHash(m_muhash, outpoint, coin);

                    m_total_prevout_spent_amount += coin.out.nValue;

                    --m_transaction_output_count;
                    m_total_amount -= coin.out.nValue;
                    m_bogo_size -= GetBogoSize(coin.out.scriptPubKey);
                }
            }
        }
    } else {
        // genesis block
        m_total_unspendable_amount += block_subsidy;
        m_total_unspendables_genesis_block += block_subsidy;
    }

    // If spent prevouts + block subsidy are still a higher amount than
    // new outputs + coinbase + current unspendable amount this means
    // the miner did not claim the full block reward. Unclaimed block
    // rewards are also unspendable.
    const CAmount unclaimed_rewards{(m_total_prevout_spent_amount + m_total_subsidy) - (m_total_new_outputs_ex_coinbase_amount + m_total_coinbase_amount + m_total_unspendable_amount)};
    m_total_unspendable_amount += unclaimed_rewards;
    m_total_unspendables_unclaimed_rewards += unclaimed_rewards;

    std::pair<uint256, DBVal> value;
    value.first = block.hash;
    value.second.transaction_output_count = m_transaction_output_count;
    value.second.bogo_size = m_bogo_size;
    value.second.total_amount = m_total_amount;
    value.second.total_subsidy = m_total_subsidy;
    value.second.total_unspendable_amount = m_total_unspendable_amount;
    value.second.total_prevout_spent_amount = m_total_prevout_spent_amount;
    value.second.total_new_outputs_ex_coinbase_amount = m_total_new_outputs_ex_coinbase_amount;
    value.second.total_coinbase_amount = m_total_coinbase_amount;
    value.second.total_unspendables_genesis_block = m_total_unspendables_genesis_block;
    value.second.total_unspendables_bip30 = m_total_unspendables_bip30;
    value.second.total_unspendables_scripts = m_total_unspendables_scripts;
    value.second.total_unspendables_unclaimed_rewards = m_total_unspendables_unclaimed_rewards;

    uint256 out;
    m_muhash.Finalize(out);
    value.second.muhash = out;

    // Intentionally do not update DB_MUHASH here so it stays in sync with
    // DB_BEST_BLOCK, and the index is not corrupted if there is an unclean shutdown.
    return m_db->Write(DBHeightKey(block.height), value);
}